

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_flush(void)

{
  term *ptVar1;
  
  if (Term != (term *)0x0) {
    if (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
      (*Term->xtra_hook)(L'\x02',L'\0');
    }
    ptVar1 = Term;
    ptVar1->key_head = 0;
    ptVar1->key_tail = 0;
  }
  return 0;
}

Assistant:

errr Term_flush(void)
{
	if (!Term)
		return 0;

	/* Hack -- Flush all events */
	Term_xtra(TERM_XTRA_FLUSH, 0);

	/* Forget all keypresses */
	Term->key_head = Term->key_tail = 0;

	/* Success */
	return (0);
}